

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

int unlink(char *__name)

{
  int iVar1;
  ll_elem *plVar2;
  ll_elem *plVar3;
  ll_elem *plVar4;
  ll_elem *plVar5;
  ll_elem *in_RSI;
  bool bVar6;
  ll_elem *i_;
  ll_elem *i;
  ll_elem *p_;
  ll_elem *p;
  ll_elem *q;
  ll_elem *n_local;
  ll_head *q_head_local;
  
  plVar2 = ptr_clear((ll_elem *)__name);
  if ((ll_elem *)__name != plVar2) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x267,
                  "int unlink(struct ll_head *, struct ll_elem *)");
  }
  plVar2 = ptr_clear(in_RSI);
  if (plVar2 == (ll_elem *)0x0) {
    __assert_fail("n != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x269,
                  "int unlink(struct ll_head *, struct ll_elem *)");
  }
  plVar3 = ptr_clear((ll_elem *)plVar2->succ);
  if (plVar3 != (ll_elem *)0x0) {
    do {
    } while ((plVar2->succ & 2) != 0);
    do {
      while( true ) {
        i = pred((ll_head *)__name,plVar2);
        plVar3 = ptr_clear(i);
        if (plVar3 == (ll_elem *)0x0) {
          return 0;
        }
        iVar1 = deleted_ptr(i);
        if (iVar1 != 0) {
          deref_release((ll_head *)__name,i,1);
          return 0;
        }
        iVar1 = unlink_ps_lock((ll_head *)__name,i,plVar2);
        if (iVar1 != 0) break;
        deref_release((ll_head *)__name,i,1);
      }
      plVar3 = ptr_clear(i);
      if ((plVar3->succ & 1) == 0) {
        __assert_fail("atomic_load_explicit(&ptr_clear(p)->succ, memory_order_relaxed) & DEREF",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x292,"int unlink(struct ll_head *, struct ll_elem *)");
      }
      plVar3 = ptr_clear(i);
      plVar3 = ptr_clear((ll_elem *)plVar3->succ);
      if (plVar3 != plVar2) {
        __assert_fail("ptr_clear((struct ll_elem*)atomic_load_explicit( &ptr_clear(p)->succ, memory_order_relaxed)) == n"
                      ,"/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x294,"int unlink(struct ll_head *, struct ll_elem *)");
      }
      plVar3 = ptr_clear(i);
      plVar3 = ptr_clear((ll_elem *)plVar3->succ);
      if (plVar3 != plVar2) {
        __assert_fail("ptr_clear((struct ll_elem*)atomic_load_explicit( &ptr_clear(p)->succ, memory_order_relaxed)) == n"
                      ,"/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x2a6,"int unlink(struct ll_head *, struct ll_elem *)");
      }
      if (((ulong)i & 1) != 0) {
        __assert_fail("!((uintptr_t)p & DEREF)",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x2a7,"int unlink(struct ll_head *, struct ll_elem *)");
      }
      if (((ulong)i & 2) != 0) {
        __assert_fail("!((uintptr_t)p & FLAGGED)",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x2a8,"int unlink(struct ll_head *, struct ll_elem *)");
      }
      plVar3 = ptr_clear(i);
      while( true ) {
        LOCK();
        plVar5 = (ll_elem *)plVar2->pred;
        bVar6 = i == plVar5;
        if (bVar6) {
          plVar2->pred = (ulong)plVar3 | 2;
          plVar5 = i;
        }
        UNLOCK();
        if (bVar6) {
          ptr_clear_deref(&plVar3->succ);
          plVar5 = succ((ll_head *)__name,plVar3);
          deref_release((ll_head *)__name,plVar5,1);
          deref_release((ll_head *)__name,plVar3,1);
          LOCK();
          *(long *)(__name + 0x18) = *(long *)(__name + 0x18) + -1;
          UNLOCK();
          plVar3 = succ((ll_head *)__name,plVar2);
          i_ = ptr_clear(plVar3);
          goto LAB_00101940;
        }
        if ((((ulong)plVar5 & 2) != 0) || (plVar4 = ptr_clear(plVar5), plVar4 != plVar3)) break;
        plVar5 = ptr_clear(plVar5);
        i = plVar3;
        if (plVar5 != plVar3) {
          __assert_fail("ptr_clear(p_) == p",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x2bf,"int unlink(struct ll_head *, struct ll_elem *)");
        }
      }
      ptr_clear_deref(&plVar3->succ);
      deref_release((ll_head *)__name,plVar3,1);
    } while (((ulong)plVar5 & 2) == 0);
  }
  return 0;
LAB_00101940:
  if (plVar2->refcnt < 2) {
LAB_001019ee:
    deref_release((ll_head *)__name,i_,1);
    return 1;
  }
  plVar3 = ptr_clear((ll_elem *)i_->pred);
  if (plVar3 == plVar2) {
    plVar3 = pred((ll_head *)__name,i_);
    deref_release((ll_head *)__name,plVar3,1);
  }
  if (i_ == (ll_elem *)__name) goto LAB_001019ee;
  plVar3 = succ((ll_head *)__name,i_);
  plVar3 = ptr_clear(plVar3);
  deref_release((ll_head *)__name,i_,1);
  i_ = plVar3;
  goto LAB_00101940;
}

Assistant:

static int
unlink(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *p, *p_, *i, *i_;

	q = &q_head->q;
	/* Argument validation. */
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	/*
	 * Since we hold the reference to n, it cannot be removed completely
	 * before we return.
	 * However it can be that this function was called while n is not on
	 * the queue, hence test that now and fail if that is the case.
	 */
	if (ptr_clear((struct ll_elem*)atomic_load_explicit(&n->succ,
	    memory_order_relaxed)) == NULL)
		return 0;

	/* Ensure n is not halfway an insert. */
	while (atomic_load_explicit(&n->succ, memory_order_relaxed) & FLAGGED)
		SPINWAIT();

restart:
	/*
	 * Update n->pred to the deleted state, taking care n->pred->succ
	 * points at n.
	 * Fails if n->pred is already marked as deleted.
	 */
	for (;;) {
		p = pred(q_head, n);
		/*
		 * p can become null, if we acquired our reference between
		 * another unlink_release detecting a refcnt of 1 and
		 * it clearing its pred/succ pointers.
		 */
		if (ptr_clear(p) == NULL)
			return 0;

		if (deleted_ptr(p)) {
			/* Another thread marked n->pred with deletion. */
			deref_release(q_head, p, 1);
			return 0;
		}

		/* Lock down p->succ and ensure it points at n. */
		if (unlink_ps_lock(q_head, p, n)) {
			assert(atomic_load_explicit(&ptr_clear(p)->succ,
			    memory_order_relaxed) & DEREF);
			assert(ptr_clear((struct ll_elem*)atomic_load_explicit(
			    &ptr_clear(p)->succ, memory_order_relaxed)) == n);
			break;			/* GUARD */
		}

		/*
		 * p no longer points at n.  Re-resolve p.
		 */
		deref_release(q_head, p, 1);
	}
	/*
	 * p - direct predecessor of n.
	 * p->succ - locked, pointing at n.
	 *
	 * Update n->prev to point at p and mark it as deleted.
	 * Note that another thread can have acquired the deletion mark,
	 * between our looking up of the predecessor and locking down p->succ.
	 */
	assert(ptr_clear((struct ll_elem*)atomic_load_explicit(
	    &ptr_clear(p)->succ, memory_order_relaxed)) == n);
	assert(!((uintptr_t)p & DEREF));
	assert(!((uintptr_t)p & FLAGGED));

	/* Acquire deletion lock. */
	p_ = p;
	p = ptr_clear(p);
	while (!atomic_compare_exchange_weak_explicit(&n->pred,
	    (uintptr_t*)&p_, (uintptr_t)p | FLAGGED,
	    memory_order_acq_rel, memory_order_relaxed)) {
		if (((uintptr_t)p_ & FLAGGED) || ptr_clear(p_) != p) {
			/* We have to restart or abort. */
			ptr_clear_deref(&p->succ);
			deref_release(q_head, p, 1);

			/* Another thread deleted n. */
			if ((uintptr_t)p_ & FLAGGED)
				return 0;
			/*
			 * n->pred changed from under us (indicates p is being
			 * deleted as well).
			 */
			goto restart;
		}

		assert(ptr_clear(p_) == p);
		p_ = p;
		SPINWAIT();
	}
	ptr_clear_deref(&p->succ);	/* Unlock p->succ. */

	/*
	 * n is succesfully marked as deleted,
	 * with the correct value for n->pred
	 * (the immediate predecessor, as required by the invariants).
	 *
	 * Update our predecessor p to skip n.
	 */
	deref_release(q_head, succ(q_head, p), 1);
	deref_release(q_head, p, 1);
	atomic_fetch_sub_explicit(&q_head->size, 1, memory_order_relaxed);

	/*
	 * Loop the list forward, clearing up references until our refcount
	 * becomes 1 or the list is exhausted.
	 */
	i = ptr_clear(succ(q_head, n));
	while (atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 1) {
		/* If i points at n, update its pred pointer. */
		if (ptr_clear((struct ll_elem*)atomic_load_explicit(&i->pred,
		    memory_order_relaxed)) == n)
			deref_release(q_head, pred(q_head, i), 1);

		/* GUARD: stop at end of q. */
		if (i == q)
			break;

		/* Skip to next element. */
		i_ = i;
		i = ptr_clear(succ(q_head, i));
		deref_release(q_head, i_, 1);
	}
	deref_release(q_head, i, 1);
	return 1;
}